

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.cc
# Opt level: O2

matrix4f * __thiscall tinyusdz::value::matrix4f::operator=(matrix4f *this,matrix4d *src)

{
  matrix4f *pmVar1;
  size_t j;
  long lVar2;
  long lVar3;
  
  pmVar1 = this;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      (*(float (*) [4])*(float (*) [4])this)[lVar3] =
           (float)(*(double (*) [4])*(double (*) [4])src)[lVar3];
    }
    this = (matrix4f *)((long)this + 0x10);
    src = (matrix4d *)((long)src + 0x20);
  }
  return pmVar1;
}

Assistant:

matrix4f &matrix4f::operator=(const matrix4d &src) {

  for (size_t j = 0; j < 4; j++) {
    for (size_t i = 0; i < 4; i++) {
      m[j][i] = float(src.m[j][i]);
    }
  }

  return *this;
}